

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineCacheTests.cpp
# Opt level: O0

void __thiscall
vkt::pipeline::anon_unknown_0::MergeCacheTestInstance::MergeCacheTestInstance
          (MergeCacheTestInstance *this,Context *context,CacheTestParam *param)

{
  VkRenderPass renderPass;
  VkPipelineCache cache;
  RefData<vk::Handle<(vk::HandleType)15>_> data;
  RefData<vk::Handle<(vk::HandleType)15>_> data_00;
  RefData<vk::Handle<(vk::HandleType)15>_> data_01;
  RefData<vk::Handle<(vk::HandleType)18>_> data_02;
  void *pvVar1;
  VkResult VVar2;
  DeviceInterface *vk_00;
  Handle<(vk::HandleType)15> *pHVar3;
  deUint8 *pdVar4;
  Handle<(vk::HandleType)17> *pHVar5;
  Handle<(vk::HandleType)16> *pHVar6;
  Vector<unsigned_int,_2> local_1a8;
  Move<vk::Handle<(vk::HandleType)18>_> local_1a0;
  RefData<vk::Handle<(vk::HandleType)18>_> local_180;
  deUint64 local_160;
  deUint64 local_158;
  VkPipelineCache sourceCaches [2];
  Move<vk::Handle<(vk::HandleType)15>_> local_140;
  RefData<vk::Handle<(vk::HandleType)15>_> local_120;
  deUint64 local_100;
  deUint64 local_f8;
  ulong local_f0;
  size_t dataSize;
  RefData<vk::Handle<(vk::HandleType)15>_> local_c8;
  Move<vk::Handle<(vk::HandleType)15>_> local_a8;
  RefData<vk::Handle<(vk::HandleType)15>_> local_88;
  undefined1 auStack_68 [8];
  VkPipelineCacheCreateInfo pipelineCacheCreateInfo;
  VkDevice vkDevice;
  DeviceInterface *vk;
  CacheTestParam *param_local;
  Context *context_local;
  MergeCacheTestInstance *this_local;
  
  GraphicsCacheTestInstance::GraphicsCacheTestInstance
            (&this->super_GraphicsCacheTestInstance,context,param);
  (this->super_GraphicsCacheTestInstance).super_CacheTestInstance.super_TestInstance.
  _vptr_TestInstance = (_func_int **)&PTR__MergeCacheTestInstance_016a3240;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)15>_>::Move(&this->m_cacheGetData);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)15>_>::Move(&this->m_cacheEmpty);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)15>_>::Move(&this->m_cacheMerged);
  this->m_data = (deUint8 *)0x0;
  vk_00 = Context::getDeviceInterface
                    ((this->super_GraphicsCacheTestInstance).super_CacheTestInstance.
                     super_TestInstance.m_context);
  pipelineCacheCreateInfo.pInitialData =
       Context::getDevice((this->super_GraphicsCacheTestInstance).super_CacheTestInstance.
                          super_TestInstance.m_context);
  pipelineCacheCreateInfo.pNext = (void *)0x0;
  pipelineCacheCreateInfo.flags = 0;
  pipelineCacheCreateInfo._20_4_ = 0;
  pipelineCacheCreateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  pipelineCacheCreateInfo._4_4_ = 0;
  pipelineCacheCreateInfo.initialDataSize = 0;
  auStack_68 = (undefined1  [8])0x11;
  ::vk::createPipelineCache
            (&local_a8,vk_00,(VkDevice)pipelineCacheCreateInfo.pInitialData,
             (VkPipelineCacheCreateInfo *)auStack_68,(VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_88,(Move *)&local_a8);
  data.deleter.m_deviceIface = local_88.deleter.m_deviceIface;
  data.object.m_internal = local_88.object.m_internal;
  data.deleter.m_device = local_88.deleter.m_device;
  data.deleter.m_allocator = local_88.deleter.m_allocator;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)15>_>::operator=(&this->m_cacheEmpty,data);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)15>_>::~Move(&local_a8);
  ::vk::createPipelineCache
            ((Move<vk::Handle<(vk::HandleType)15>_> *)&dataSize,vk_00,
             (VkDevice)pipelineCacheCreateInfo.pInitialData,(VkPipelineCacheCreateInfo *)auStack_68,
             (VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_c8,(Move *)&dataSize);
  data_00.deleter.m_deviceIface = local_c8.deleter.m_deviceIface;
  data_00.object.m_internal = local_c8.object.m_internal;
  data_00.deleter.m_device = local_c8.deleter.m_device;
  data_00.deleter.m_allocator = local_c8.deleter.m_allocator;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)15>_>::operator=(&this->m_cacheMerged,data_00);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)15>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)15>_> *)&dataSize);
  pvVar1 = pipelineCacheCreateInfo.pInitialData;
  local_f0 = 0;
  pHVar3 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)15>_>::operator*
                     (&(this->super_GraphicsCacheTestInstance).super_CacheTestInstance.m_cache.
                       super_RefBase<vk::Handle<(vk::HandleType)15>_>);
  local_f8 = pHVar3->m_internal;
  VVar2 = (*vk_00->_vptr_DeviceInterface[0x2e])(vk_00,pvVar1,local_f8,&local_f0,0);
  ::vk::checkResult(VVar2,
                    "vk.getPipelineCacheData(vkDevice, *m_cache, (deUintptr*)&dataSize, DE_NULL)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineCacheTests.cpp"
                    ,0x662);
  pdVar4 = (deUint8 *)operator_new__(local_f0);
  pvVar1 = pipelineCacheCreateInfo.pInitialData;
  this->m_data = pdVar4;
  pHVar3 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)15>_>::operator*
                     (&(this->super_GraphicsCacheTestInstance).super_CacheTestInstance.m_cache.
                       super_RefBase<vk::Handle<(vk::HandleType)15>_>);
  local_100 = pHVar3->m_internal;
  VVar2 = (*vk_00->_vptr_DeviceInterface[0x2e])(vk_00,pvVar1,local_100,&local_f0,this->m_data);
  ::vk::checkResult(VVar2,
                    "vk.getPipelineCacheData(vkDevice, *m_cache, (deUintptr*)&dataSize, (void*)m_data)"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineCacheTests.cpp"
                    ,0x666);
  pipelineCacheCreateInfo._16_8_ = local_f0;
  pipelineCacheCreateInfo.initialDataSize = (deUintptr)this->m_data;
  ::vk::createPipelineCache
            (&local_140,vk_00,(VkDevice)pipelineCacheCreateInfo.pInitialData,
             (VkPipelineCacheCreateInfo *)auStack_68,(VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_120,(Move *)&local_140);
  data_01.deleter.m_deviceIface = local_120.deleter.m_deviceIface;
  data_01.object.m_internal = local_120.object.m_internal;
  data_01.deleter.m_device = local_120.deleter.m_device;
  data_01.deleter.m_allocator = local_120.deleter.m_allocator;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)15>_>::operator=(&this->m_cacheGetData,data_01);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)15>_>::~Move(&local_140);
  pHVar3 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)15>_>::operator*
                     (&(this->m_cacheEmpty).super_RefBase<vk::Handle<(vk::HandleType)15>_>);
  local_158 = pHVar3->m_internal;
  pHVar3 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)15>_>::operator*
                     (&(this->m_cacheGetData).super_RefBase<vk::Handle<(vk::HandleType)15>_>);
  pvVar1 = pipelineCacheCreateInfo.pInitialData;
  sourceCaches[0].m_internal = pHVar3->m_internal;
  pHVar3 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)15>_>::operator*
                     (&(this->m_cacheMerged).super_RefBase<vk::Handle<(vk::HandleType)15>_>);
  local_160 = pHVar3->m_internal;
  VVar2 = (*vk_00->_vptr_DeviceInterface[0x2f])(vk_00,pvVar1,local_160,2,&local_158);
  ::vk::checkResult(VVar2,"vk.mergePipelineCaches(vkDevice, *m_cacheMerged, 2u, sourceCaches)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/pipeline/vktPipelineCacheTests.cpp"
                    ,0x673);
  tcu::Vector<unsigned_int,_2>::Vector
            (&local_1a8,&(this->super_GraphicsCacheTestInstance).m_renderSize);
  pHVar5 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::operator*
                     (&(this->super_GraphicsCacheTestInstance).m_renderPass.
                       super_RefBase<vk::Handle<(vk::HandleType)17>_>);
  renderPass.m_internal = pHVar5->m_internal;
  pHVar3 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)15>_>::operator*
                     (&(this->m_cacheMerged).super_RefBase<vk::Handle<(vk::HandleType)15>_>);
  cache.m_internal = pHVar3->m_internal;
  pHVar6 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::operator*
                     (&(this->super_GraphicsCacheTestInstance).m_pipelineLayout.
                       super_RefBase<vk::Handle<(vk::HandleType)16>_>);
  SimpleGraphicsPipelineBuilder::buildPipeline
            (&local_1a0,
             (SimpleGraphicsPipelineBuilder *)
             &(this->super_GraphicsCacheTestInstance).m_pipelineBuilder,&local_1a8,renderPass,cache,
             (VkPipelineLayout)pHVar6->m_internal);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_180,(Move *)&local_1a0);
  data_02.deleter.m_deviceIface = local_180.deleter.m_deviceIface;
  data_02.object.m_internal = local_180.object.m_internal;
  data_02.deleter.m_device = local_180.deleter.m_device;
  data_02.deleter.m_allocator = local_180.deleter.m_allocator;
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>::operator=
            ((this->super_GraphicsCacheTestInstance).m_pipeline + 1,data_02);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>::~Move(&local_1a0);
  return;
}

Assistant:

MergeCacheTestInstance::MergeCacheTestInstance (Context& context, const CacheTestParam* param)
	: GraphicsCacheTestInstance (context, param)
	, m_data                    (DE_NULL)
{
	const DeviceInterface&  vk               = m_context.getDeviceInterface();
	const VkDevice          vkDevice         = m_context.getDevice();

	// Create more pipeline caches
	{
		// Create a empty cache as one of source cache
		VkPipelineCacheCreateInfo pipelineCacheCreateInfo =
		{
			VK_STRUCTURE_TYPE_PIPELINE_CACHE_CREATE_INFO,           // VkStructureType             sType;
			DE_NULL,                                                // const void*                 pNext;
			0u,                                                     // VkPipelineCacheCreateFlags  flags;
			0u,                                                     // deUintptr                   initialDataSize;
			DE_NULL,                                                // const void*                 pInitialData;
		};
		m_cacheEmpty = createPipelineCache(vk, vkDevice, &pipelineCacheCreateInfo);

		// Create a empty cache for merge destination cache
		m_cacheMerged = createPipelineCache(vk, vkDevice, &pipelineCacheCreateInfo);

		// Create a cache with init data from m_cache
		size_t  dataSize = 0u;
		VK_CHECK(vk.getPipelineCacheData(vkDevice, *m_cache, (deUintptr*)&dataSize, DE_NULL));

		m_data = new deUint8[dataSize];
		DE_ASSERT(m_data);
		VK_CHECK(vk.getPipelineCacheData(vkDevice, *m_cache, (deUintptr*)&dataSize, (void*)m_data));

		pipelineCacheCreateInfo.initialDataSize = dataSize;
		pipelineCacheCreateInfo.pInitialData = m_data;
		m_cacheGetData = createPipelineCache(vk, vkDevice, &pipelineCacheCreateInfo);
	}

	// Merge the caches
	const VkPipelineCache sourceCaches[] =
	{
		*m_cacheEmpty,
		*m_cacheGetData,
	};
	VK_CHECK(vk.mergePipelineCaches(vkDevice, *m_cacheMerged, 2u, sourceCaches));

	// Create pipeline from merged cache
	m_pipeline[PIPELINE_CACHE_NDX_CACHED] = m_pipelineBuilder.buildPipeline(m_renderSize, *m_renderPass, *m_cacheMerged, *m_pipelineLayout);
}